

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O3

int ssl_parse_alpn_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  int iVar1;
  size_t __n;
  int iVar2;
  byte *pbVar3;
  char **ppcVar4;
  ulong uVar5;
  char *local_48;
  
  ppcVar4 = ssl->conf->alpn_list;
  iVar2 = 0;
  if (((ppcVar4 != (char **)0x0) && (iVar2 = -0x7900, 3 < len)) &&
     ((ulong)(ushort)(*(ushort *)buf << 8 | *(ushort *)buf >> 8) == len - 2)) {
    local_48 = *ppcVar4;
    if (local_48 != (char *)0x0) {
      do {
        __n = strlen(local_48);
        pbVar3 = buf + 2;
        do {
          if (buf + len < pbVar3) {
            return -0x7900;
          }
          uVar5 = (ulong)*pbVar3;
          if (uVar5 == 0) {
            return -0x7900;
          }
          if ((__n == uVar5) && (iVar1 = bcmp(pbVar3 + 1,local_48,__n), iVar1 == 0)) {
            ssl->alpn_chosen = local_48;
            return 0;
          }
          pbVar3 = pbVar3 + 1 + uVar5;
        } while (pbVar3 != buf + len);
        local_48 = ppcVar4[1];
        ppcVar4 = ppcVar4 + 1;
      } while (local_48 != (char *)0x0);
    }
    mbedtls_ssl_send_alert_message(ssl,'\x02','x');
  }
  return iVar2;
}

Assistant:

static int ssl_parse_alpn_ext( mbedtls_ssl_context *ssl,
                               const unsigned char *buf, size_t len )
{
    size_t list_len, cur_len, ours_len;
    const unsigned char *theirs, *start, *end;
    const char **ours;

    /* If ALPN not configured, just ignore the extension */
    if( ssl->conf->alpn_list == NULL )
        return( 0 );

    /*
     * opaque ProtocolName<1..2^8-1>;
     *
     * struct {
     *     ProtocolName protocol_name_list<2..2^16-1>
     * } ProtocolNameList;
     */

    /* Min length is 2 (list_len) + 1 (name_len) + 1 (name) */
    if( len < 4 )
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );

    list_len = ( buf[0] << 8 ) | buf[1];
    if( list_len != len - 2 )
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );

    /*
     * Use our order of preference
     */
    start = buf + 2;
    end = buf + len;
    for( ours = ssl->conf->alpn_list; *ours != NULL; ours++ )
    {
        ours_len = strlen( *ours );
        for( theirs = start; theirs != end; theirs += cur_len )
        {
            /* If the list is well formed, we should get equality first */
            if( theirs > end )
                return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );

            cur_len = *theirs++;

            /* Empty strings MUST NOT be included */
            if( cur_len == 0 )
                return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );

            if( cur_len == ours_len &&
                memcmp( theirs, *ours, cur_len ) == 0 )
            {
                ssl->alpn_chosen = *ours;
                return( 0 );
            }
        }
    }

    /* If we get there, no match was found */
    mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                            MBEDTLS_SSL_ALERT_MSG_NO_APPLICATION_PROTOCOL );
    return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
}